

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this;
  cmMakefile *this_00;
  string *this_01;
  string_view val;
  cmOutputConverter *local_1f8;
  cmStateSnapshot local_188;
  cmStateDirectory local_170;
  undefined1 local_148 [8];
  cmLinkLineDeviceComputer deviceLinkComputer;
  cmComputeLinkInformation *pcli;
  undefined1 local_f8 [6];
  bool doDeviceLinking;
  string *local_d8;
  LinkClosure *local_d0;
  LinkClosure *closure;
  char *local_c0;
  allocator<char> local_b1;
  string local_b0;
  cmValue local_90;
  cmValue resolveDeviceSymbols;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  
  local_28 = config;
  config_local = (string *)lg;
  lg_local = (cmLocalGenerator *)target;
  this = cmGeneratorTarget::GetGlobalGenerator(target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"CUDA",&local_49);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lg_local);
    if (TVar3 == OBJECT_LIBRARY) {
      target_local._7_1_ = 0;
    }
    else {
      this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)config_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE",
                 (allocator<char> *)((long)&resolveDeviceSymbols.Value + 7));
      bVar2 = cmMakefile::IsOn(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&resolveDeviceSymbols.Value + 7));
      pcVar1 = lg_local;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"CUDA_RESOLVE_DEVICE_SYMBOLS",&local_b1);
        local_90 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
        bVar2 = cmValue::operator_cast_to_bool(&local_90);
        if (bVar2) {
          this_01 = cmValue::operator*[abi_cxx11_(&local_90);
          val = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
          local_c0 = val._M_str;
          closure = (LinkClosure *)val._M_len;
          target_local._7_1_ = cmIsOn(val);
        }
        else {
          local_d0 = cmGeneratorTarget::GetLinkClosure((cmGeneratorTarget *)lg_local,local_28);
          bVar2 = cm::
                  contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                            (&local_d0->Languages,(char (*) [5])"CUDA");
          pcVar1 = lg_local;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_f8,"CUDA_SEPARABLE_COMPILATION",
                       (allocator<char> *)((long)&pcli + 7));
            local_d8 = (string *)
                       cmGeneratorTarget::GetProperty
                                 ((cmGeneratorTarget *)pcVar1,(string *)local_f8);
            bVar2 = cmIsOn((cmValue)local_d8);
            std::__cxx11::string::~string((string *)local_f8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&pcli + 7));
            if (bVar2) {
              pcli._6_1_ = 0;
              TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lg_local);
              if ((TVar3 == EXECUTABLE) || (TVar3 - SHARED_LIBRARY < 2)) {
                pcli._6_1_ = 1;
              }
              target_local._7_1_ = pcli._6_1_ & 1;
            }
            else {
              deviceLinkComputer.super_cmLinkLineComputer._56_8_ =
                   cmGeneratorTarget::GetLinkInformation((cmGeneratorTarget *)lg_local,local_28);
              if ((cmComputeLinkInformation *)deviceLinkComputer.super_cmLinkLineComputer._56_8_ ==
                  (cmComputeLinkInformation *)0x0) {
                target_local._7_1_ = 1;
              }
              else {
                local_1f8 = (cmOutputConverter *)0x0;
                if (config_local != (string *)0x0) {
                  local_1f8 = (cmOutputConverter *)&config_local->_M_string_length;
                }
                cmLocalGenerator::GetStateSnapshot(&local_188,(cmLocalGenerator *)config_local);
                cmStateSnapshot::GetDirectory(&local_170,&local_188);
                cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                          ((cmLinkLineDeviceComputer *)local_148,local_1f8,&local_170);
                target_local._7_1_ =
                     cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                               ((cmLinkLineDeviceComputer *)local_148,
                                (cmComputeLinkInformation *)
                                deviceLinkComputer.super_cmLinkLineComputer._56_8_);
                cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
                          ((cmLinkLineDeviceComputer *)local_148);
              }
            }
          }
          else {
            target_local._7_1_ = 0;
          }
        }
      }
      else {
        target_local._7_1_ = 0;
      }
    }
  }
  else {
    target_local._7_1_ = 0;
  }
  return (bool)(target_local._7_1_ & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (!lg.GetMakefile()->IsOn("CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE")) {
    return false;
  }

  if (cmValue resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmIsOn(*resolveDeviceSymbols);
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  if (cm::contains(closure->Languages, "CUDA")) {
    if (cmIsOn(target.GetProperty("CUDA_SEPARABLE_COMPILATION"))) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }

    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}